

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_window_is_any_hovered(nk_context *ctx)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  nk_window *pnVar4;
  nk_window *pnVar5;
  int iVar6;
  nk_window **ppnVar7;
  undefined8 uVar8;
  nk_rect rect;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x445b,"int nk_window_is_any_hovered(struct nk_context *)");
  }
  ppnVar7 = &ctx->begin;
  while( true ) {
    pnVar4 = *ppnVar7;
    if (pnVar4 == (nk_window *)0x0) {
      return 0;
    }
    uVar2 = (pnVar4->bounds).x;
    uVar3 = (pnVar4->bounds).y;
    rect.y = (float)uVar3;
    rect.x = (float)uVar2;
    uVar8._0_4_ = (pnVar4->bounds).w;
    uVar8._4_4_ = (pnVar4->bounds).h;
    if ((pnVar4->flags & 0x4000) != 0) {
      fVar1 = (ctx->style).window.header.padding.y;
      uVar8 = CONCAT44(fVar1 + fVar1 + ((ctx->style).font)->height,(undefined4)uVar8);
    }
    rect.w = (float)(int)uVar8;
    rect.h = (float)(int)((ulong)uVar8 >> 0x20);
    iVar6 = nk_input_is_mouse_hovering_rect(&ctx->input,rect);
    if (iVar6 != 0) break;
    if ((((pnVar4->popup).active != 0) && (pnVar5 = (pnVar4->popup).win, pnVar5 != (nk_window *)0x0)
        ) && (iVar6 = nk_input_is_mouse_hovering_rect(&ctx->input,pnVar5->bounds), iVar6 != 0)) {
      return 1;
    }
    ppnVar7 = &pnVar4->next;
  }
  return 1;
}

Assistant:

NK_API int
nk_window_is_any_hovered(struct nk_context *ctx)
{
    struct nk_window *iter;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    iter = ctx->begin;
    while (iter) {
        /* check if window is being hovered */
        if (iter->flags & NK_WINDOW_MINIMIZED) {
            struct nk_rect header = iter->bounds;
            header.h = ctx->style.font->height + 2 * ctx->style.window.header.padding.y;
            if (nk_input_is_mouse_hovering_rect(&ctx->input, header))
                return 1;
        } else if (nk_input_is_mouse_hovering_rect(&ctx->input, iter->bounds)) {
            return 1;
        }
        /* check if window popup is being hovered */
        if (iter->popup.active && iter->popup.win && nk_input_is_mouse_hovering_rect(&ctx->input, iter->popup.win->bounds))
            return 1;
        iter = iter->next;
    }
    return 0;
}